

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VScaleVectorArray(int nvec,realtype *c,N_Vector *X,N_Vector *Z)

{
  int local_2c;
  int i;
  N_Vector *Z_local;
  N_Vector *X_local;
  realtype *c_local;
  int nvec_local;
  
  if ((*Z)->ops->nvscalevectorarray == (_func_int_int_realtype_ptr_N_Vector_ptr_N_Vector_ptr *)0x0)
  {
    for (local_2c = 0; local_2c < nvec; local_2c = local_2c + 1) {
      (*(*Z)->ops->nvscale)(c[local_2c],X[local_2c],Z[local_2c]);
    }
    c_local._4_4_ = 0;
  }
  else {
    c_local._4_4_ = (*(*Z)->ops->nvscalevectorarray)(nvec,c,X,Z);
  }
  return c_local._4_4_;
}

Assistant:

int N_VScaleVectorArray(int nvec, realtype* c, N_Vector* X, N_Vector* Z)
{
  int i;

  if (Z[0]->ops->nvscalevectorarray != NULL) {
    
    return(Z[0]->ops->nvscalevectorarray(nvec, c, X, Z));

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvscale(c[i], X[i], Z[i]);
    }
    return(0);

  }
}